

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

SubMeshXml * __thiscall Assimp::Ogre::MeshXml::GetSubMesh(MeshXml *this,uint16_t index)

{
  pointer ppSVar1;
  SubMeshXml *pSVar2;
  long lVar3;
  long lVar4;
  
  ppSVar1 = (this->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->subMeshes).
                super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    lVar4 = 0;
    do {
      pSVar2 = ppSVar1[lVar4];
      if ((pSVar2->super_ISubMesh).index == (uint)index) {
        return pSVar2;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return (SubMeshXml *)0x0;
}

Assistant:

SubMeshXml *MeshXml::GetSubMesh(uint16_t index) const
{
    for(size_t i=0; i<subMeshes.size(); ++i)
        if (subMeshes[i]->index == index)
            return subMeshes[i];
    return 0;
}